

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hash.h
# Opt level: O0

BackwardMatch * __thiscall
brotli::HashToBinaryTree::StoreAndFindMatches
          (HashToBinaryTree *this,uint8_t *data,size_t cur_ix,size_t ring_buffer_mask,
          size_t max_length,size_t *best_len,BackwardMatch *matches)

{
  uint uVar1;
  unsigned_long uVar2;
  uint32_t *puVar3;
  unsigned_long *puVar4;
  size_t sVar5;
  BackwardMatch local_b0;
  ulong local_a8;
  size_t len;
  size_t cur_len;
  size_t prev_ix_masked;
  size_t backward;
  size_t depth_remaining;
  size_t best_len_right;
  size_t best_len_left;
  size_t node_right;
  size_t node_left;
  size_t prev_ix;
  uint32_t key;
  bool reroot_tree;
  size_t max_comp_len;
  size_t max_backward;
  size_t cur_ix_masked;
  size_t *best_len_local;
  size_t max_length_local;
  size_t ring_buffer_mask_local;
  size_t cur_ix_local;
  uint8_t *data_local;
  HashToBinaryTree *this_local;
  
  max_backward = cur_ix & ring_buffer_mask;
  max_comp_len = this->window_mask_ - 0xf;
  cur_ix_masked = (size_t)best_len;
  best_len_local = (size_t *)max_length;
  max_length_local = ring_buffer_mask;
  ring_buffer_mask_local = cur_ix;
  cur_ix_local = (size_t)data;
  data_local = (uint8_t *)this;
  puVar4 = std::min<unsigned_long>((unsigned_long *)&best_len_local,&kMaxTreeCompLength);
  _key = *puVar4;
  prev_ix._7_1_ = (size_t *)0x7f < best_len_local;
  prev_ix._0_4_ = HashBytes((uint8_t *)(cur_ix_local + max_backward));
  node_left = (size_t)this->buckets_[(uint32_t)prev_ix];
  node_right = LeftChildIndex(this,ring_buffer_mask_local);
  best_len_left = RightChildIndex(this,ring_buffer_mask_local);
  best_len_right = 0;
  depth_remaining = 0;
  if ((prev_ix._7_1_ & 1) != 0) {
    this->buckets_[(uint32_t)prev_ix] = (uint32_t)ring_buffer_mask_local;
  }
  backward = 0x40;
  do {
    prev_ix_masked = ring_buffer_mask_local - node_left;
    cur_len = node_left & max_length_local;
    if (((prev_ix_masked == 0) || (max_comp_len < prev_ix_masked)) || (backward == 0)) {
      if ((prev_ix._7_1_ & 1) != 0) {
        this->forest_[node_right] = this->invalid_pos_;
        this->forest_[best_len_left] = this->invalid_pos_;
      }
      return matches;
    }
    puVar4 = std::min<unsigned_long>(&best_len_right,&depth_remaining);
    uVar2 = *puVar4;
    len = uVar2;
    sVar5 = FindMatchLengthWithLimit
                      ((uint8_t *)(cur_ix_local + max_backward + uVar2),
                       (uint8_t *)(cur_ix_local + cur_len + uVar2),(long)best_len_local - uVar2);
    local_a8 = uVar2 + sVar5;
    if (*(ulong *)cur_ix_masked < local_a8) {
      *(ulong *)cur_ix_masked = local_a8;
      if (matches != (BackwardMatch *)0x0) {
        BackwardMatch::BackwardMatch(&local_b0,prev_ix_masked,local_a8);
        *matches = local_b0;
        matches = matches + 1;
      }
      if (_key <= local_a8) {
        if ((prev_ix._7_1_ & 1) == 0) {
          return matches;
        }
        puVar3 = this->forest_;
        sVar5 = LeftChildIndex(this,node_left);
        this->forest_[node_right] = puVar3[sVar5];
        puVar3 = this->forest_;
        sVar5 = RightChildIndex(this,node_left);
        this->forest_[best_len_left] = puVar3[sVar5];
        return matches;
      }
    }
    if (*(byte *)(cur_ix_local + cur_len + local_a8) <
        *(byte *)(cur_ix_local + max_backward + local_a8)) {
      best_len_right = local_a8;
      if ((prev_ix._7_1_ & 1) != 0) {
        this->forest_[node_right] = (uint32_t)node_left;
      }
      node_right = RightChildIndex(this,node_left);
      uVar1 = this->forest_[node_right];
    }
    else {
      depth_remaining = local_a8;
      if ((prev_ix._7_1_ & 1) != 0) {
        this->forest_[best_len_left] = (uint32_t)node_left;
      }
      best_len_left = LeftChildIndex(this,node_left);
      uVar1 = this->forest_[best_len_left];
    }
    node_left = (size_t)uVar1;
    backward = backward - 1;
  } while( true );
}

Assistant:

BackwardMatch* StoreAndFindMatches(const uint8_t* const __restrict data,
                                     const size_t cur_ix,
                                     const size_t ring_buffer_mask,
                                     const size_t max_length,
                                     size_t* const __restrict best_len,
                                     BackwardMatch* __restrict matches) {
    const size_t cur_ix_masked = cur_ix & ring_buffer_mask;
    const size_t max_backward = window_mask_ - 15;
    const size_t max_comp_len = std::min(max_length, kMaxTreeCompLength);
    const bool reroot_tree = max_length >= kMaxTreeCompLength;
    const uint32_t key = HashBytes(&data[cur_ix_masked]);
    size_t prev_ix = buckets_[key];
    // The forest index of the rightmost node of the left subtree of the new
    // root, updated as we traverse and reroot the tree of the hash bucket.
    size_t node_left = LeftChildIndex(cur_ix);
    // The forest index of the leftmost node of the right subtree of the new
    // root, updated as we traverse and reroot the tree of the hash bucket.
    size_t node_right = RightChildIndex(cur_ix);
    // The match length of the rightmost node of the left subtree of the new
    // root, updated as we traverse and reroot the tree of the hash bucket.
    size_t best_len_left = 0;
    // The match length of the leftmost node of the right subtree of the new
    // root, updated as we traverse and reroot the tree of the hash bucket.
    size_t best_len_right = 0;
    if (reroot_tree) {
      buckets_[key] = static_cast<uint32_t>(cur_ix);
    }
    for (size_t depth_remaining = kMaxTreeSearchDepth; ; --depth_remaining) {
      const size_t backward = cur_ix - prev_ix;
      const size_t prev_ix_masked = prev_ix & ring_buffer_mask;
      if (backward == 0 || backward > max_backward || depth_remaining == 0) {
        if (reroot_tree) {
          forest_[node_left] = invalid_pos_;
          forest_[node_right] = invalid_pos_;
        }
        break;
      }
      const size_t cur_len = std::min(best_len_left, best_len_right);
      const size_t len = cur_len +
          FindMatchLengthWithLimit(&data[cur_ix_masked + cur_len],
                                   &data[prev_ix_masked + cur_len],
                                   max_length - cur_len);
      if (len > *best_len) {
        *best_len = len;
        if (matches) {
          *matches++ = BackwardMatch(backward, len);
        }
        if (len >= max_comp_len) {
          if (reroot_tree) {
            forest_[node_left] = forest_[LeftChildIndex(prev_ix)];
            forest_[node_right] = forest_[RightChildIndex(prev_ix)];
          }
          break;
        }
      }
      if (data[cur_ix_masked + len] > data[prev_ix_masked + len]) {
        best_len_left = len;
        if (reroot_tree) {
          forest_[node_left] = static_cast<uint32_t>(prev_ix);
        }
        node_left = RightChildIndex(prev_ix);
        prev_ix = forest_[node_left];
      } else {
        best_len_right = len;
        if (reroot_tree) {
          forest_[node_right] = static_cast<uint32_t>(prev_ix);
        }
        node_right = LeftChildIndex(prev_ix);
        prev_ix = forest_[node_right];
      }
    }
    return matches;
  }